

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_SimRsbFree(Gia_SimRsbMan_t *p)

{
  Gia_SimRsbMan_t *p_local;
  
  Gia_ManStaticFanoutStop(p->pGia);
  Vec_IntFree(p->vTfo);
  Vec_IntFree(p->vCands);
  Vec_IntFree(p->vFanins);
  Vec_IntFree(p->vFanins2);
  Vec_WrdFree(p->vSimsObj);
  Vec_WrdFree(p->vSimsObj2);
  if (p->pFunc[0] != (word *)0x0) {
    free(p->pFunc[0]);
    p->pFunc[0] = (word *)0x0;
  }
  if (p->pFunc[1] != (word *)0x0) {
    free(p->pFunc[1]);
    p->pFunc[1] = (word *)0x0;
  }
  if (p->pFunc[2] != (word *)0x0) {
    free(p->pFunc[2]);
    p->pFunc[2] = (word *)0x0;
  }
  if (p != (Gia_SimRsbMan_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Gia_SimRsbFree( Gia_SimRsbMan_t * p )
{
    Gia_ManStaticFanoutStop( p->pGia );
    Vec_IntFree( p->vTfo );
    Vec_IntFree( p->vCands );
    Vec_IntFree( p->vFanins );
    Vec_IntFree( p->vFanins2 );
    Vec_WrdFree( p->vSimsObj );
    Vec_WrdFree( p->vSimsObj2 );
    ABC_FREE( p->pFunc[0] );
    ABC_FREE( p->pFunc[1] );
    ABC_FREE( p->pFunc[2] );
    ABC_FREE( p );
}